

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    State *state,uchar *in,size_t insize)

{
  uchar *__first;
  uint uVar1;
  size_t sVar2;
  uchar *buffer;
  uchar *local_38;
  
  local_38 = (uchar *)0x0;
  uVar1 = lodepng_decode(&local_38,w,h,&state->super_LodePNGState,in,insize);
  __first = local_38;
  if (uVar1 == 0 && local_38 != (uchar *)0x0) {
    sVar2 = lodepng_get_raw_size(*w,*h,&(state->super_LodePNGState).info_raw);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
               (const_iterator)
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,__first,__first + sVar2);
  }
  free(__first);
  return uVar1;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h,
                State& state,
                const unsigned char* in, size_t insize) {
  unsigned char* buffer = NULL;
  unsigned error = lodepng_decode(&buffer, &w, &h, &state, in, insize);
  if(buffer && !error) {
    size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
    out.insert(out.end(), buffer, &buffer[buffersize]);
  }
  lodepng_free(buffer);
  return error;
}